

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonObjectFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  char *in_RDX;
  uint in_ESI;
  sqlite3_value *in_RDI;
  long in_FS_OFFSET;
  u32 n;
  char *z;
  int i;
  JsonString jx;
  undefined7 in_stack_ffffffffffffff38;
  char in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff40;
  int iVar3;
  JsonParse *pParse;
  undefined4 in_stack_ffffffffffffff50;
  u32 N;
  undefined4 in_stack_ffffffffffffff60;
  JsonString *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&stack0xffffffffffffff70,0xaa,0x88);
  pParse = (JsonParse *)&DAT_aaaaaaaaaaaaaaaa;
  iVar3 = -0x55555556;
  if ((in_ESI & 1) == 0) {
    jsonStringInit((JsonString *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffff40),
                   (sqlite3_context *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38))
    ;
    jsonAppendChar((JsonString *)CONCAT44(iVar3,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3f
                  );
    for (N = 0; (int)N < (int)in_ESI; N = N + 2) {
      iVar2 = sqlite3_value_type(*(sqlite3_value **)(in_RDX + (long)(int)N * 8));
      if (iVar2 != 3) {
        sqlite3_result_error
                  ((sqlite3_context *)CONCAT44(iVar3,in_stack_ffffffffffffff40),
                   (char *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),0);
        jsonStringReset((JsonString *)0x230320);
        goto LAB_002303dc;
      }
      jsonAppendSeparator((JsonString *)CONCAT44(iVar3,in_stack_ffffffffffffff40));
      pParse = (JsonParse *)sqlite3_value_text((sqlite3_value *)0x230342);
      iVar3 = sqlite3_value_bytes((sqlite3_value *)0x23035a);
      jsonAppendString((JsonString *)CONCAT44(in_ESI,in_stack_ffffffffffffff60),in_RDX,N);
      jsonAppendChar((JsonString *)CONCAT44(iVar3,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff3f);
      jsonAppendSqlValue(in_stack_ffffffffffffff70,in_RDI);
    }
    jsonAppendChar((JsonString *)CONCAT44(iVar3,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3f
                  );
    jsonReturnString((JsonString *)CONCAT44(N,in_stack_ffffffffffffff50),pParse,
                     (sqlite3_context *)CONCAT44(iVar3,in_stack_ffffffffffffff40));
    sqlite3_result_subtype((sqlite3_context *)in_RDI,0x4a);
  }
  else {
    sqlite3_result_error
              ((sqlite3_context *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffff40),
               (char *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),0);
  }
LAB_002303dc:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonObjectFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;
  const char *z;
  u32 n;

  if( argc&1 ){
    sqlite3_result_error(ctx, "json_object() requires an even number "
                                  "of arguments", -1);
    return;
  }
  jsonStringInit(&jx, ctx);
  jsonAppendChar(&jx, '{');
  for(i=0; i<argc; i+=2){
    if( sqlite3_value_type(argv[i])!=SQLITE_TEXT ){
      sqlite3_result_error(ctx, "json_object() labels must be TEXT", -1);
      jsonStringReset(&jx);
      return;
    }
    jsonAppendSeparator(&jx);
    z = (const char*)sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    jsonAppendString(&jx, z, n);
    jsonAppendChar(&jx, ':');
    jsonAppendSqlValue(&jx, argv[i+1]);
  }
  jsonAppendChar(&jx, '}');
  jsonReturnString(&jx, 0, 0);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}